

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.cpp
# Opt level: O2

void Opcodes::AAA(SFLAG_Register *sfr,GEN_Register *gr,RAM *mem,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *cmd)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  string *this;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"AL",&local_da);
  bVar1 = GEN_Register::getReg_8(gr,&local_d8);
  if ((bVar1 & 0xe) < 10) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AF",&local_d9);
    bVar2 = SFLAG_Register::getFlag(sfr,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_d8);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"SF",&local_da);
      SFLAG_Register::setFlag(sfr,&local_98,false);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"AF",&local_da);
      SFLAG_Register::setFlag(sfr,&local_b8,false);
      this = &local_b8;
      goto LAB_00106bd5;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"AL",&local_da);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"AL",&local_d9);
  uVar3 = GEN_Register::getReg_8(gr,&local_78);
  GEN_Register::setReg_8(gr,&local_58,uVar3 + 6 & 0xf);
  std::__cxx11::string::~string((string *)&local_78);
  this = &local_58;
LAB_00106bd5:
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void Opcodes::AAA(SFLAG_Register &sfr, GEN_Register &gr, RAM &mem, std::vector<std::string> &cmd) {
    if (((gr.getReg_8("AL") & 0x0F) > 9) || (sfr.getFlag("AF") == 1)) {
        gr.setReg_8("AL", (gr.getReg_8("AL") + 6) & 0x0F);
    } else {
        sfr.setFlag("SF", 0);
        sfr.setFlag("AF", 0);
    }
}